

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O0

double icu_63::IndianToJD(int32_t year,int32_t month,int32_t date)

{
  UBool UVar1;
  int year_00;
  undefined8 local_30;
  double jd;
  double start;
  int32_t m;
  int32_t gyear;
  int32_t leapMonth;
  int32_t date_local;
  int32_t month_local;
  int32_t year_local;
  
  year_00 = year + 0x4e;
  UVar1 = isGregorianLeap(year_00);
  if (UVar1 == '\0') {
    m = 0x1e;
    jd = gregorianToJD(year_00,3,0x16);
  }
  else {
    m = 0x1f;
    jd = gregorianToJD(year_00,3,0x15);
  }
  if (month == 1) {
    local_30 = jd + (double)(date + -1);
  }
  else {
    start._0_4_ = month + -2;
    if (5 < start._0_4_) {
      start._0_4_ = 5;
    }
    local_30 = (double)(start._0_4_ * 0x1f) + jd + (double)m;
    if (7 < month) {
      local_30 = (double)((month + -7) * 0x1e) + local_30;
    }
    local_30 = (double)(date + -1) + local_30;
  }
  return local_30;
}

Assistant:

static double IndianToJD(int32_t year, int32_t month, int32_t date) {
   int32_t leapMonth, gyear, m;
   double start, jd;

   gyear = year + INDIAN_ERA_START;


   if(isGregorianLeap(gyear)) {
      leapMonth = 31;
      start = gregorianToJD(gyear, 3, 21);
   } 
   else {
      leapMonth = 30;
      start = gregorianToJD(gyear, 3, 22);
   }

   if (month == 1) {
      jd = start + (date - 1);
   } else {
      jd = start + leapMonth;
      m = month - 2;

      //m = Math.min(m, 5);
      if (m > 5) {
          m = 5;
      }

      jd += m * 31;

      if (month >= 8) {
         m = month - 7;
         jd += m * 30;
      }
      jd += date - 1;
   }

   return jd;
}